

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Array * __thiscall json::Array::add<json::Float,double>(Array *this,double *v)

{
  _func_int **pp_Var1;
  XPtr<json::Type> local_20;
  
  local_20.t = (Type *)operator_new(0x10);
  pp_Var1 = (_func_int **)*v;
  (local_20.t)->_vptr_Type = (_func_int **)&PTR_clone_00128d08;
  local_20.t[1]._vptr_Type = pp_Var1;
  std::vector<common::XPtr<json::Type>,common::clean_allocator<common::XPtr<json::Type>>>::
  emplace_back<common::XPtr<json::Type>>
            ((vector<common::XPtr<json::Type>,common::clean_allocator<common::XPtr<json::Type>>> *)
             &this->fields,&local_20);
  if (local_20.t != (Type *)0x0) {
    operator_delete(local_20.t,8);
  }
  return this;
}

Assistant:

Array& add(V const& v) {
            fields.push_back(new T(v));
            return *this;
        }